

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.cc
# Opt level: O1

int BUF_MEM_grow(BUF_MEM *str,size_t len)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = BUF_MEM_reserve((BUF_MEM *)str,len);
  if (iVar2 == 0) {
    len = 0;
  }
  else {
    uVar1 = str->length;
    if (uVar1 <= len && len - uVar1 != 0) {
      memset(str->data + uVar1,0,len - uVar1);
    }
    str->length = len;
  }
  return (int)len;
}

Assistant:

size_t BUF_MEM_grow(BUF_MEM *buf, size_t len) {
  if (!BUF_MEM_reserve(buf, len)) {
    return 0;
  }
  if (buf->length < len) {
    OPENSSL_memset(&buf->data[buf->length], 0, len - buf->length);
  }
  buf->length = len;
  return len;
}